

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deriv.c
# Opt level: O0

void matchmassage(int nderiv)

{
  Symbol *pSVar1;
  uint uVar2;
  uint in_EDI;
  char *imatch;
  List *vmatch;
  List *tmatch;
  Symbol *s;
  Item *setup;
  Item *q1;
  Item *q;
  int j;
  int nunknown;
  int count;
  char *in_stack_ffffffffffffffa8;
  Item *str;
  List *in_stack_ffffffffffffffb0;
  Item *in_stack_ffffffffffffffb8;
  Item *pIVar3;
  List *l;
  List *local_20;
  Item *local_18;
  uint local_10;
  uint local_8;
  
  matchused = 0;
  local_8 = 0;
  local_18 = match_init->next;
  do {
    if (local_18 == match_init) {
      uVar2 = in_EDI - local_8;
      if ((int)uVar2 < 1) {
        diag((char *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      lappendstr(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      sprintf(buf,"for (_i=0; _i<%d; _i++) _found_init[_i] = _p[_state_get[_i]];\n",(ulong)uVar2);
      lappendstr(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      sprintf(buf,
              "error=shoot(%d, &(%s) - _p, _pmatch_time, _pmatch_value, _state_match, _found_init, _p, &(d%s));\n if(error){abort_run(error);}; %s = _save;"
              ,(ulong)uVar2,indepsym->name,indepsym->name,indepsym->name);
      lappendstr(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      lappendstr(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      sprintf(buf,"for (_i=0; _i<%d; _i++) _p[_state_get[_i]] = _found_init[_i];",(ulong)uVar2);
      lappendstr(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      lappendstr(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      local_10 = 0;
      for (local_18 = deriv_state_list->next; local_18 != deriv_state_list;
          local_18 = local_18->next) {
        pSVar1 = (local_18->element).sym;
        if ((pSVar1->subtype & 0x20U) == 0) {
          sprintf(buf,"_state_get[%d] = &(%s) - _p;\n",(ulong)local_10,pSVar1->name);
          local_10 = local_10 + 1;
        }
        else {
          sprintf(buf,"for (_i=0; _i<%d; _i++) {_state_get[%d+_i] = (%s + _i) - _p;}\n",
                  (ulong)(uint)pSVar1->araydim,(ulong)local_10,pSVar1->name);
          local_10 = pSVar1->araydim + local_10;
        }
        lappendstr(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      str = (Item *)CONCAT44((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),uVar2);
      sprintf(buf,
              "static int _state_get[%d], _state_match[%d];\nstatic double _match_time[%d], _match_value[%d], _found_init[%d];\n"
              ,(ulong)uVar2,(ulong)uVar2,(ulong)uVar2,(ulong)uVar2);
      linsertstr(in_stack_ffffffffffffffb0,(char *)str);
      sprintf(buf,"static double *_pmatch_time[%d], *_pmatch_value[%d];\n",(ulong)uVar2,(ulong)uVar2
             );
      linsertstr(in_stack_ffffffffffffffb0,(char *)str);
      local_10 = 0;
      for (local_18 = match_bound->next; local_18 != match_bound; local_18 = local_18->next) {
        pSVar1 = (local_18->element).sym;
        if ((pSVar1->subtype & 0x10U) == 0) {
          diag((char *)in_stack_ffffffffffffffb0,(char *)str);
        }
        local_18 = local_18->next->next;
        l = (local_18->element).lst;
        if ((pSVar1->subtype & 0x20U) == 0) {
          sprintf(buf,"_state_match[%d] = &(%s) - _p;\n",(ulong)local_10,pSVar1->name);
          lappendstr(in_stack_ffffffffffffffb0,(char *)str);
          sprintf(buf,"_match_time[%d] = ",(ulong)local_10);
          insertstr(in_stack_ffffffffffffffb0,(char *)str);
          copylist(l,in_stack_ffffffffffffffb8);
          sprintf(buf,";\n _match_value[%d] = ",(ulong)local_10);
          insertstr(in_stack_ffffffffffffffb0,(char *)str);
          copylist(l,in_stack_ffffffffffffffb8);
          insertstr(in_stack_ffffffffffffffb0,(char *)str);
          local_10 = local_10 + 1;
          local_8 = local_8 + 1;
        }
        else {
          local_18 = local_18->next;
          pIVar3 = (Item *)(local_18->element).str;
          sprintf(buf,"for (_i=0; _i<%d; _i++) {_state_match[%d+_i] = (%s + _i) - _p;}\n",
                  (ulong)(uint)pSVar1->araydim,(ulong)local_10,pSVar1->name);
          lappendstr(in_stack_ffffffffffffffb0,(char *)str);
          str = pIVar3;
          in_stack_ffffffffffffffb8 = str;
          sprintf(buf,"{int %s; for (%s=0; %s<%d; %s++) {\n",str,str,str,
                  (ulong)(uint)pSVar1->araydim);
          insertstr(in_stack_ffffffffffffffb0,(char *)str);
          sprintf(buf,"_match_time[%s + %d] = ",in_stack_ffffffffffffffb8,(ulong)local_10);
          insertstr(in_stack_ffffffffffffffb0,(char *)str);
          copylist(l,in_stack_ffffffffffffffb8);
          sprintf(buf,";\n _match_value[%s + %d] = ",in_stack_ffffffffffffffb8,(ulong)local_10);
          insertstr(in_stack_ffffffffffffffb0,(char *)str);
          copylist(l,in_stack_ffffffffffffffb8);
          insertstr(in_stack_ffffffffffffffb0,(char *)str);
          local_10 = pSVar1->araydim + local_10;
          local_8 = pSVar1->araydim + local_8;
        }
      }
      sprintf(buf,"for(_i=0; _i<%d; _i++) { _pmatch_time[_i] = _match_time + _i;\n",(ulong)uVar2);
      lappendstr(in_stack_ffffffffffffffb0,(char *)str);
      lappendstr(in_stack_ffffffffffffffb0,(char *)str);
      if (local_8 != in_EDI) {
        sprintf(buf,"%d equations != %d MATCH specs",(ulong)in_EDI,(ulong)local_8);
        diag((char *)in_stack_ffffffffffffffb0,(char *)str);
      }
      return;
    }
    pSVar1 = (local_18->element).sym;
    for (local_20 = deriv_state_list->next; local_20 != deriv_state_list; local_20 = local_20->next)
    {
      if ((Symbol *)(local_20->element).itm == pSVar1) {
        delete((Item *)0x11ca54);
        break;
      }
    }
    if (((ulong)((anon_union_8_4_46e41722_for_element *)&pSVar1->subtype)->itm & 0x10) == 0) {
      diag((char *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    if (((ulong)((anon_union_8_4_46e41722_for_element *)&pSVar1->subtype)->itm & 0x20) == 0) {
      local_8 = local_8 + 1;
    }
    else {
      local_8 = pSVar1->araydim + local_8;
    }
    local_18 = local_18->next;
  } while( true );
}

Assistant:

void matchmassage(nderiv)
	int nderiv;
{
	int count, nunknown, j;
	Item *q, *q1, *setup;
	Symbol *s;
	List *tmatch, *vmatch;
	char *imatch;

	matchused = 0;
	/* we have a list of states at which the initial values are known
	and a list of information about state(time) = match with implicit loop
	index if array.
	
	check that the total number of conditions = nderiv.
	the number of unknown initial conditions is the complement of the
	states which have known initial conditions ( the number of states
	in the match_bound list. Note that the complement of match_init
	states is NOT the list of states in match_bound.
	
	We create
	  1) array of doubles which will receive the values of
	  the found initial conditions. (_found_init)
	  2) array of doubles which receives the match times
	  3) array of doubles which receives the match values
	  4) array of state pointers(state_match). we solve
	     *statematch(matchtime) = matchvalue
	  5) array of state pointers(state_get). We initialize with
	     *state_get = _found_init
	  6) since 2, 3, 4 must be sorted according to match times we
	     create pointer arrays to 2 and 3 and pass those.
	  7) Spec of shoot requires the passing of pointer array to
	     found_init.


	At this time I don't know how this can be restarted.
	
	Initmodel() calls _initmatch() which
	1) if first=1 then sets first=0
	sets up match times, match values, initializes
	_found_init, calls shoot(), calls initmodel(),
	sets first = 1 and exits.
	2) if first=0 then put _found_init into states and exit.
	
	Call to _initmatch must be the last thing done in initmodel() in
	case the user desires to give good starting initial values to
	help shoot().
	*/

	count = 0;
	
	ITERATE(q, match_init) { /* these initializations are done
		automatically by initmodel(), so just remove the state
		from the deriv_state_list */
		s = SYM(q);
		ITERATE(q1, deriv_state_list) {
			if (SYM(q1) == s) {
				delete(q1);
				break;
			}
		}
		if (!(s->subtype & STAT)) {
			diag(s->name, " is not a state");
		}
		if (s->subtype & ARRAY) {
			count += s->araydim;
		}else{
			count++;
		}
	}
	nunknown = nderiv - count;
	if (nunknown <= 0) {
		diag("Nothing to match", (char *)0);
	}
	/* the ones that are still marked are the ones to solve for */
	
	/* add the boilerplate for _initmatch and save the location
	where model specific info goes.
	*/
Lappendstr(procfunc, "\n_init_match(_save) double _save;{ int _i;\nif (_match_recurse) {_match_recurse = 0;\n");
Sprintf(buf, "for (_i=0; _i<%d; _i++) _found_init[_i] = _p[_state_get[_i]];\n",
		nunknown);
	setup = lappendstr(procfunc, buf);
Sprintf(buf, "error=shoot(%d, &(%s) - _p, _pmatch_time, _pmatch_value, _state_match,\
 _found_init, _p, &(d%s));\n if(error){abort_run(error);}; %s = _save;",
		nunknown, indepsym->name, indepsym->name, indepsym->name);
		/*deltaindep may not be declared yet */
	Lappendstr(procfunc, buf);
	Lappendstr(procfunc,"\n initmodel(_p); _match_recurse = 1;\n}\n");
	Sprintf(buf, "for (_i=0; _i<%d; _i++) _p[_state_get[_i]] = _found_init[_i];",
		nunknown);
	Lappendstr(procfunc, buf);
	Lappendstr(procfunc, "\n}\n\n");

	/* construct _state_get from the marked states */
	j = 0;

	ITERATE(q, deriv_state_list) {
		s = SYM(q);
		if (s->subtype & ARRAY) {
Sprintf(buf, "for (_i=0; _i<%d; _i++) {_state_get[%d+_i] = (%s + _i) - _p;}\n",
	s->araydim, j, s->name);
			j += s->araydim;
		} else {
			Sprintf(buf, "_state_get[%d] = &(%s) - _p;\n", j, s->name);
			j++;
		}
		Lappendstr(initlist, buf);
	}
	/* declare the arrays */
	Sprintf(buf, "static int _state_get[%d], _state_match[%d];\n\
static double _match_time[%d], _match_value[%d], _found_init[%d];\n",
		nunknown, nunknown, nunknown, nunknown, nunknown);
	Linsertstr(procfunc, buf);
	Sprintf(buf, "static double *_pmatch_time[%d], *_pmatch_value[%d];\n",
 		nunknown, nunknown);
	Linsertstr(procfunc, buf);
	
	/* create the _state_match stuff */
	j = 0;
	ITERATE(q, match_bound) {
		s = SYM(q);
		if (!(s->subtype & STAT)) {
			diag(s->name, " is not a state");
		}
		tmatch = LST(q = q->next);
		vmatch = LST(q = q->next);
		if (s->subtype & ARRAY) {
			imatch = STR(q = q->next);
Sprintf(buf, "for (_i=0; _i<%d; _i++) {_state_match[%d+_i] = (%s + _i) - _p;}\n",
			s->araydim, j, s->name);
			Lappendstr(initlist, buf);
Sprintf(buf, "{int %s; for (%s=0; %s<%d; %s++) {\n",
imatch, imatch, imatch, s->araydim, imatch);
			Insertstr(setup, buf);
Sprintf(buf, "_match_time[%s + %d] = ", imatch, j);
			Insertstr(setup, buf);
			copylist(tmatch, setup);
Sprintf(buf, ";\n _match_value[%s + %d] = ", imatch, j);
			Insertstr(setup, buf);
			copylist(vmatch, setup);
			Insertstr(setup, ";\n}}\n");
			j += s->araydim;
			count += s->araydim;
		}else{
Sprintf(buf, "_state_match[%d] = &(%s) - _p;\n", j, s->name);
			Lappendstr(initlist, buf);
Sprintf(buf, "_match_time[%d] = ", j);
			Insertstr(setup, buf);
			copylist(tmatch, setup);
Sprintf(buf, ";\n _match_value[%d] = ", j);
			Insertstr(setup, buf);
			copylist(vmatch, setup);
			Insertstr(setup, ";\n");
			j++;
			count++;
		}
	}
	/* set up the trivial pointer arrays */
	Sprintf(buf, "for(_i=0; _i<%d; _i++) { _pmatch_time[_i] = _match_time + _i;\n",
		nunknown);
	Lappendstr(initlist, buf);
	Lappendstr(initlist, "_pmatch_value[_i] = _match_value + _i;\n }\n");
	if (count != nderiv) {
		Sprintf(buf, "%d equations != %d MATCH specs", nderiv, count);
		diag(buf, (char *)0);
	}
			
}